

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O1

int lreplace(RSIZE plen,char *st)

{
  byte *pbVar1;
  ushort *puVar2;
  long lVar3;
  int iVar4;
  byte *__s;
  size_t sVar5;
  ushort **ppuVar6;
  __int32_t **pp_Var7;
  uint uVar8;
  ushort uVar9;
  char *pcVar10;
  line *plVar11;
  uint len;
  uint uVar12;
  ulong uVar13;
  
  iVar4 = checkdirty(curbp);
  if (iVar4 != 1) {
    return iVar4;
  }
  if ((curbp->b_flag & 0x10U) == 0) {
    __s = (byte *)strdup(st);
    if (__s != (byte *)0x0) {
      sVar5 = strlen((char *)__s);
      undo_boundary_enable(8,0);
      backchar(0xf,plen);
      len = (uint)sVar5;
      if (casereplace == 1) {
        plVar11 = curwp->w_dotp;
        pcVar10 = plVar11->l_text;
        if (pcVar10 != (char *)0x0) {
          uVar13 = (ulong)curwp->w_doto;
          ppuVar6 = __ctype_b_loc();
          puVar2 = *ppuVar6;
          pbVar1 = (byte *)(pcVar10 + uVar13);
          uVar8 = 1;
          if (((puVar2[*pbVar1] >> 8 & 1) != 0) && (uVar8 = 0, 0 < plen)) {
            do {
              uVar9 = 1;
              if ((puVar2[(byte)plVar11->l_text[(int)uVar13]] >> 10 & 1) != 0) {
                uVar9 = puVar2[(byte)plVar11->l_text[(int)uVar13]] >> 8 & 1;
              }
              uVar12 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar12;
              if (uVar12 == plVar11->l_used) {
                plVar11 = plVar11->l_fp;
                uVar8 = uVar8 + 1;
                uVar13 = 0;
              }
            } while ((uVar9 != 0) && (uVar8 = uVar8 + 1, (int)uVar8 < plen));
            uVar8 = (uint)(uVar9 == 0);
          }
          if (0 < (int)len) {
            uVar13 = 1;
            do {
              lVar3 = uVar13 - 1;
              if ((len & 0x7fffffff) <= uVar13) break;
              uVar13 = uVar13 + 1;
            } while ((puVar2[__s[lVar3]] & 0x100) == 0);
            if ((puVar2[__s[lVar3]] >> 8 & 1) != 0) goto LAB_001139dd;
          }
          if ((char)uVar8 == '\0') {
            if (0 < (int)len) {
              pp_Var7 = __ctype_toupper_loc();
              uVar13 = 0;
              do {
                __s[uVar13] = *(byte *)(*pp_Var7 + __s[uVar13]);
                uVar13 = uVar13 + 1;
              } while ((len & 0x7fffffff) != uVar13);
            }
          }
          else if ((puVar2[*pbVar1] >> 8 & 1) != 0) {
            pp_Var7 = __ctype_toupper_loc();
            *__s = *(byte *)(*pp_Var7 + *__s);
          }
        }
      }
LAB_001139dd:
      ldelete(plen,0);
      region_put_data((char *)__s,len);
      lchange(8);
      undo_boundary_enable(8,1);
      free(__s);
      return 1;
    }
    dobeep();
    pcVar10 = "out of memory";
  }
  else {
    dobeep();
    pcVar10 = "Buffer is read only";
  }
  ewprintf(pcVar10);
  return 0;
}

Assistant:

int
lreplace(RSIZE plen, char *st)
{
	RSIZE	rlen;	/* replacement length		 */
	struct line *lp;
	RSIZE n;
	int s, doto, is_query_capitalised = 0, is_query_allcaps = 0;
	int is_replace_alllower = 0;
	char *repl = NULL;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read only");
		return (FALSE);
	}

	if ((repl = strdup(st)) == NULL) {
		dobeep();
		ewprintf("out of memory");
		return (FALSE);
	}
	rlen = strlen(repl);

	undo_boundary_enable(FFRAND, 0);
	(void)backchar(FFARG | FFRAND, (int)plen);

	if (casereplace != TRUE)
		goto done;

	lp = curwp->w_dotp;
	if (ltext(lp) == NULL)
		goto done;
	doto = curwp->w_doto;
	n = plen;

	is_query_capitalised = isupper((unsigned char)lgetc(lp, doto));

	if (is_query_capitalised) {
		for (n = 0, is_query_allcaps = 1; n < plen && is_query_allcaps;
		    n++) {
			is_query_allcaps = !isalpha((unsigned char)lgetc(lp,
			    doto)) || isupper((unsigned char)lgetc(lp, doto));
			doto++;
			if (doto == llength(lp)) {
				doto = 0;
				lp = lforw(lp);
				n++; /* \n is implicit in the buffer */
			}
		}
	}

	for (n = 0, is_replace_alllower = 1; n < rlen && is_replace_alllower;
	    n++)
		is_replace_alllower = !isupper((unsigned char)repl[n]);

	if (is_replace_alllower) {
		if (is_query_allcaps) {
			for (n = 0; n < rlen; n++)
				repl[n] = toupper((unsigned char)repl[n]);
		} else if (is_query_capitalised) {
			repl[0] = toupper((unsigned char)repl[0]);
		}
	}

 done:
	(void)ldelete(plen, KNONE);
	region_put_data(repl, rlen);
	lchange(WFFULL);

	undo_boundary_enable(FFRAND, 1);

	free(repl);
	return (TRUE);
}